

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O2

int check_control(char *s)

{
  char *__s;
  int iVar1;
  size_t __n;
  long lVar2;
  deflist *pdVar3;
  
  if (in_line[0] == '%') {
    pdVar3 = deflist;
    for (lVar2 = 0; lVar2 != 1; lVar2 = lVar2 + 1) {
      __s = pdVar3->defname;
      __n = strlen(__s);
      iVar1 = strncmp(__s,in_line + 1,__n);
      if (iVar1 == 0) {
        return (int)lVar2;
      }
      pdVar3 = pdVar3 + 1;
    }
  }
  return -1;
}

Assistant:

static int check_control(char *s)
{
	int	i;

	if (s[0] != '%') return -1;

	for (i = 0; deflist[i].defname; i++)
	    if (!strncmp(deflist[i].defname, s+1, strlen(deflist[i].defname)))
		return i;

	return -1;
}